

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_lz4.c
# Opt level: O1

void test_compat_lz4(void)

{
  uchar *in_RCX;
  size_t in_RDX;
  size_t siglen;
  size_t siglen_00;
  size_t siglen_01;
  size_t siglen_02;
  size_t siglen_03;
  size_t siglen_04;
  size_t siglen_05;
  size_t siglen_06;
  size_t siglen_07;
  size_t siglen_08;
  size_t siglen_09;
  size_t in_R8;
  
  verify((EVP_PKEY_CTX *)"test_compat_lz4_1.tar.lz4.uu",&DAT_003058d0,in_RDX,in_RCX,in_R8);
  verify((EVP_PKEY_CTX *)"test_compat_lz4_2.tar.lz4.uu",&DAT_003058d0,siglen,in_RCX,in_R8);
  verify((EVP_PKEY_CTX *)"test_compat_lz4_3.tar.lz4.uu",&DAT_003058d0,siglen_00,in_RCX,in_R8);
  verify((EVP_PKEY_CTX *)"test_compat_lz4_B4.tar.lz4.uu","<U*",siglen_01,in_RCX,in_R8);
  verify((EVP_PKEY_CTX *)"test_compat_lz4_B5.tar.lz4.uu","<U*",siglen_02,in_RCX,in_R8);
  verify((EVP_PKEY_CTX *)"test_compat_lz4_B6.tar.lz4.uu","<U*",siglen_03,in_RCX,in_R8);
  verify((EVP_PKEY_CTX *)"test_compat_lz4_B7.tar.lz4.uu","<U*",siglen_04,in_RCX,in_R8);
  verify((EVP_PKEY_CTX *)"test_compat_lz4_B4BD.tar.lz4.uu","<U*",siglen_05,in_RCX,in_R8);
  verify((EVP_PKEY_CTX *)"test_compat_lz4_B5BD.tar.lz4.uu","<U*",siglen_06,in_RCX,in_R8);
  verify((EVP_PKEY_CTX *)"test_compat_lz4_B6BD.tar.lz4.uu","<U*",siglen_07,in_RCX,in_R8);
  verify((EVP_PKEY_CTX *)"test_compat_lz4_B7BD.tar.lz4.uu","<U*",siglen_08,in_RCX,in_R8);
  verify((EVP_PKEY_CTX *)"test_compat_lz4_B4BDBX.tar.lz4.uu","<U*",siglen_09,in_RCX,in_R8);
  return;
}

Assistant:

DEFINE_TEST(test_compat_lz4)
{
	const char *n[7] = { "f1", "f2", "f3", "d1/f1", "d1/f2", "d1/f3", NULL };
	const char *n2[7] = { "xfile", "README", "NEWS", NULL };
	/* This sample has been 'split', each piece compressed separately,
	 * then concatenated.  Lz4 will emit the concatenated result. */
	/* Not supported in libarchive 2.6 and earlier */
	verify("test_compat_lz4_1.tar.lz4.uu", n);
	/* This sample has been compressed as a single stream, but then
	 * some unrelated garbage text has been appended to the end. */
	verify("test_compat_lz4_2.tar.lz4.uu", n);
	/* This sample has been compressed as a legacy stream. */
	verify("test_compat_lz4_3.tar.lz4.uu", n);
	/* This sample has been compressed with -B4 option. */
	verify("test_compat_lz4_B4.tar.lz4.uu", n2);
	/* This sample has been compressed with -B5 option. */
	verify("test_compat_lz4_B5.tar.lz4.uu", n2);
	/* This sample has been compressed with -B6 option. */
	verify("test_compat_lz4_B6.tar.lz4.uu", n2);
	/* This sample has been compressed with -B7 option. */
	verify("test_compat_lz4_B7.tar.lz4.uu", n2);
	/* This sample has been compressed with -B4 and -BD options. */
	verify("test_compat_lz4_B4BD.tar.lz4.uu", n2);
	/* This sample has been compressed with -B5 and -BD options. */
	verify("test_compat_lz4_B5BD.tar.lz4.uu", n2);
	/* This sample has been compressed with -B6 and -BD options. */
	verify("test_compat_lz4_B6BD.tar.lz4.uu", n2);
	/* This sample has been compressed with -B7 and -BD options. */
	verify("test_compat_lz4_B7BD.tar.lz4.uu", n2);
	/* This sample has been compressed with -B4 ,-BD and -BX options. */
	verify("test_compat_lz4_B4BDBX.tar.lz4.uu", n2);
}